

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

int run_test_poll_oob(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uint uVar3;
  int extraout_EAX_01;
  uint extraout_EAX_02;
  int extraout_EAX_03;
  uv_idle_t *loop;
  ssize_t sVar4;
  int *piVar5;
  uint extraout_EDX;
  char *unaff_RBX;
  uv_tcp_t *puVar6;
  uv_poll_t *puVar7;
  int *unaff_R14;
  sockaddr_in *unaff_R15;
  sockaddr_in *psVar8;
  sockaddr_in *psVar9;
  sockaddr_in *psVar10;
  sockaddr_in *psVar11;
  sockaddr_in *psVar12;
  sockaddr_in *psVar13;
  sockaddr_in addr;
  undefined1 auStack_5c [20];
  int *piStack_48;
  undefined1 *puStack_40;
  sockaddr_in sStack_28;
  
  psVar8 = &sStack_28;
  psVar9 = &sStack_28;
  psVar10 = &sStack_28;
  psVar11 = &sStack_28;
  psVar12 = &sStack_28;
  psVar13 = &sStack_28;
  puVar6 = (uv_tcp_t *)0x1a4b3a;
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
  if (iVar1 == 0) {
    unaff_RBX = (char *)uv_default_loop();
    iVar2 = 0x3290e0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&server_handle);
    if (iVar1 != 0) goto LAB_00164723;
    iVar2 = 0x3291d8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&client_handle);
    if (iVar1 != 0) goto LAB_00164728;
    iVar2 = 0x3292d0;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&peer_handle);
    if (iVar1 != 0) goto LAB_0016472d;
    iVar2 = 0x3293c8;
    puVar6 = (uv_tcp_t *)unaff_RBX;
    iVar1 = uv_idle_init((uv_loop_t *)unaff_RBX,&idle);
    if (iVar1 != 0) goto LAB_00164732;
    puVar6 = &server_handle;
    iVar2 = (int)&sStack_28;
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&sStack_28,0);
    if (iVar1 != 0) goto LAB_00164737;
    puVar6 = &server_handle;
    iVar2 = 1;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
    if (iVar1 != 0) goto LAB_0016473c;
    puVar6 = &client_handle;
    iVar2 = 1;
    iVar1 = uv_tcp_nodelay(&client_handle,1);
    if (iVar1 != 0) goto LAB_00164741;
    puVar6 = (uv_tcp_t *)0x2;
    iVar2 = 1;
    client_fd = socket(2,1,0);
    if (-1 < client_fd) {
      unaff_R14 = __errno_location();
      do {
        *unaff_R14 = 0;
        puVar6 = (uv_tcp_t *)(ulong)(uint)client_fd;
        iVar2 = (int)&sStack_28;
        iVar1 = connect(client_fd,(sockaddr *)&sStack_28,0x10);
        if (iVar1 != -1) {
          if (iVar1 == 0) {
            iVar2 = 0;
            puVar6 = (uv_tcp_t *)unaff_RBX;
            iVar1 = uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
            if (iVar1 != 0) goto LAB_0016474b;
            if (ticks != 10) goto LAB_00164750;
            if (cli_pr_check == '\0') goto LAB_00164755;
            if (cli_rd_check != 2) goto LAB_0016475a;
            if (srv_rd_check == '\0') goto LAB_0016475f;
            unaff_RBX = (char *)uv_default_loop();
            uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
            iVar2 = 0;
            uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
            puVar6 = (uv_tcp_t *)uv_default_loop();
            iVar1 = uv_loop_close((uv_loop_t *)puVar6);
            if (iVar1 == 0) {
              return 0;
            }
            goto LAB_00164764;
          }
          break;
        }
      } while (*unaff_R14 == 4);
      run_test_poll_oob_cold_16();
      unaff_R15 = &sStack_28;
      goto LAB_0016471e;
    }
  }
  else {
LAB_0016471e:
    run_test_poll_oob_cold_1();
LAB_00164723:
    run_test_poll_oob_cold_2();
LAB_00164728:
    run_test_poll_oob_cold_3();
LAB_0016472d:
    run_test_poll_oob_cold_4();
LAB_00164732:
    run_test_poll_oob_cold_5();
LAB_00164737:
    run_test_poll_oob_cold_6();
LAB_0016473c:
    run_test_poll_oob_cold_7();
LAB_00164741:
    run_test_poll_oob_cold_8();
  }
  psVar8 = unaff_R15;
  run_test_poll_oob_cold_9();
LAB_0016474b:
  run_test_poll_oob_cold_10();
  psVar9 = psVar8;
LAB_00164750:
  run_test_poll_oob_cold_11();
  psVar10 = psVar9;
LAB_00164755:
  run_test_poll_oob_cold_12();
  psVar11 = psVar10;
LAB_0016475a:
  run_test_poll_oob_cold_13();
  psVar12 = psVar11;
LAB_0016475f:
  run_test_poll_oob_cold_14();
  psVar13 = psVar12;
LAB_00164764:
  run_test_poll_oob_cold_15();
  if (iVar2 == 0) {
    iVar2 = uv_accept((uv_stream_t *)puVar6,(uv_stream_t *)&peer_handle);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_001648ae;
    puVar6 = &peer_handle;
    iVar2 = uv_fileno((uv_handle_t *)&peer_handle,&server_fd);
    loop = (uv_idle_t *)puVar6;
    if (iVar2 != 0) goto LAB_001648b3;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req,client_fd);
    if (iVar2 != 0) goto LAB_001648b8;
    loop = (uv_idle_t *)uv_default_loop();
    iVar2 = uv_poll_init_socket((uv_loop_t *)loop,poll_req + 1,server_fd);
    if (iVar2 != 0) goto LAB_001648bd;
    puVar7 = poll_req;
    iVar2 = uv_poll_start(poll_req,0xb,poll_cb);
    loop = (uv_idle_t *)puVar7;
    if (iVar2 != 0) goto LAB_001648c2;
    loop = (uv_idle_t *)(poll_req + 1);
    iVar2 = uv_poll_start(poll_req + 1,1,poll_cb);
    if (iVar2 != 0) goto LAB_001648c7;
    do {
      sVar4 = send(server_fd,"hello",5,1);
      iVar2 = (int)sVar4;
      if (-1 < iVar2) goto LAB_00164857;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    do {
      connection_cb_cold_10();
      iVar2 = extraout_EAX;
LAB_00164857:
    } while (iVar2 != 5);
    unaff_RBX = "world";
    do {
      sVar4 = send(server_fd,"world",5,0);
      iVar2 = (int)sVar4;
      if (-1 < iVar2) goto LAB_0016488b;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    do {
      connection_cb_cold_9();
      iVar2 = extraout_EAX_00;
LAB_0016488b:
    } while (iVar2 != 5);
    loop = &idle;
    iVar2 = uv_idle_start(&idle,idle_cb);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connection_cb_cold_1();
    loop = (uv_idle_t *)puVar6;
LAB_001648ae:
    connection_cb_cold_2();
LAB_001648b3:
    connection_cb_cold_3();
LAB_001648b8:
    connection_cb_cold_4();
LAB_001648bd:
    connection_cb_cold_5();
LAB_001648c2:
    connection_cb_cold_6();
LAB_001648c7:
    connection_cb_cold_7();
  }
  connection_cb_cold_8();
  auStack_5c._12_8_ = unaff_RBX;
  piStack_48 = unaff_R14;
  puStack_40 = (undefined1 *)psVar13;
  iVar2 = uv_fileno((uv_handle_t *)loop,(uv_os_fd_t *)(auStack_5c + 8));
  puVar7 = (uv_poll_t *)loop;
  if (iVar2 != 0) goto LAB_00164b7a;
  auStack_5c[4] = '\0';
  auStack_5c._0_4_ = 0;
  uVar3 = 0;
  if ((extraout_EDX & 8) != 0) {
    do {
      puVar7 = (uv_poll_t *)(ulong)(uint)client_fd;
      sVar4 = recv(client_fd,auStack_5c,5,1);
      if ((int)sVar4 != -1) {
        if (-1 < (int)sVar4) goto LAB_00164945;
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar2 = *piVar5;
    } while (iVar2 == 4);
    if (iVar2 == 0x16) goto LAB_00164b89;
LAB_00164945:
    cli_pr_check = '\x01';
    puVar7 = poll_req;
    iVar2 = uv_poll_stop(poll_req);
    if (iVar2 != 0) goto LAB_00164b7f;
    puVar7 = poll_req;
    uVar3 = uv_poll_start(poll_req,3,poll_cb);
    if (uVar3 != 0) goto LAB_00164b84;
  }
  if ((extraout_EDX & 1) == 0) goto LAB_00164b31;
  if (auStack_5c._8_4_ != client_fd) goto LAB_00164aba;
  do {
    puVar7 = (uv_poll_t *)(ulong)(uint)client_fd;
    sVar4 = recv(client_fd,auStack_5c,5,0);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (-1 < iVar2) goto LAB_001649df;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      break;
    }
    piVar5 = __errno_location();
    iVar1 = *piVar5;
  } while (iVar1 == 4);
  if (iVar1 == 0x16) {
LAB_00164b9f:
    poll_cb_cold_15();
LAB_00164ba4:
    poll_cb_cold_10();
LAB_00164ba9:
    poll_cb_cold_5();
LAB_00164bae:
    poll_cb_cold_11();
  }
  else {
LAB_001649df:
    if (cli_rd_check != 0) {
      if (cli_rd_check != 1) {
LAB_00164aba:
        uVar3 = auStack_5c._8_4_;
        if (auStack_5c._8_4_ != server_fd) {
LAB_00164b31:
          if ((extraout_EDX & 2) != 0) {
            do {
              sVar4 = send(client_fd,"foo",3,0);
              uVar3 = (uint)sVar4;
              if (-1 < (int)uVar3) goto LAB_00164b65;
              piVar5 = __errno_location();
            } while (*piVar5 == 4);
            do {
              poll_cb_cold_16();
              uVar3 = extraout_EAX_02;
LAB_00164b65:
            } while (uVar3 != 3);
          }
          return uVar3;
        }
        do {
          puVar7 = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar4 = recv(server_fd,auStack_5c,3,0);
          iVar2 = (int)sVar4;
          if (iVar2 != -1) goto LAB_00164afb;
          piVar5 = __errno_location();
          iVar2 = *piVar5;
        } while (iVar2 == 4);
LAB_00164af1:
        if (iVar2 != 0x16) {
LAB_00164b75:
          poll_cb_cold_13();
LAB_00164b7a:
          poll_cb_cold_1();
LAB_00164b7f:
          poll_cb_cold_2();
LAB_00164b84:
          poll_cb_cold_3();
LAB_00164b89:
          poll_cb_cold_4();
LAB_00164b8e:
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          goto LAB_00164af1;
        }
        poll_cb_cold_14();
        iVar2 = extraout_EAX_01;
LAB_00164afb:
        if (iVar2 < 0) goto LAB_00164b8e;
        if (iVar2 != 3) goto LAB_00164b75;
        if (auStack_5c[2] == 'o' && (short)auStack_5c._0_4_ == 0x6f66) {
          srv_rd_check = '\x01';
          uVar3 = uv_poll_stop(poll_req + 1);
          goto LAB_00164b31;
        }
        poll_cb_cold_12();
        goto LAB_00164b9f;
      }
      puVar7 = (uv_poll_t *)auStack_5c;
      iVar1 = strncmp((char *)puVar7,"world",(long)iVar2);
      if (iVar1 != 0) goto LAB_00164ba4;
      if (iVar2 == 5) {
        cli_rd_check = 2;
        goto LAB_00164aba;
      }
      goto LAB_00164bae;
    }
    if (iVar2 != 4) goto LAB_00164ba9;
    if (auStack_5c._0_4_ == 0x6c6c6568) {
      iVar2 = 1;
      do {
        while( true ) {
          cli_rd_check = iVar2;
          puVar7 = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar4 = recv(server_fd,auStack_5c,5,0);
          iVar2 = (int)sVar4;
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          iVar2 = cli_rd_check;
          if (iVar1 != 4) goto LAB_00164aac;
        }
        if (iVar2 < 1) goto LAB_00164aa5;
        if (iVar2 != 5) goto LAB_00164bb8;
        iVar2 = 2;
      } while (auStack_5c[4] == 'd' && auStack_5c._0_4_ == 0x6c726f77);
      poll_cb_cold_8();
LAB_00164aa5:
      piVar5 = __errno_location();
      iVar1 = *piVar5;
LAB_00164aac:
      if ((iVar1 != 0xb) && (iVar1 != 0x73)) goto LAB_00164bbd;
      goto LAB_00164aba;
    }
  }
  poll_cb_cold_6();
LAB_00164bb8:
  poll_cb_cold_7();
LAB_00164bbd:
  poll_cb_cold_9();
  uv_sleep(100);
  iVar2 = ticks;
  ticks = ticks + 1;
  if (8 < iVar2) {
    uv_poll_stop(poll_req);
    uv_poll_stop(poll_req + 1);
    uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&client_handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&peer_handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)puVar7,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}